

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

Message * __thiscall Message::operator=(Message *this,Message *msg)

{
  size_t sVar1;
  
  if (this != msg) {
    this->msg_type = msg->msg_type;
    this->t = msg->t;
    this->c = msg->c;
    std::__cxx11::string::_M_assign((string *)&this->o);
    std::__cxx11::string::_M_assign((string *)&this->d);
    sVar1 = msg->n;
    this->v = msg->v;
    this->n = sVar1;
  }
  return this;
}

Assistant:

Message &Message::operator=(const Message &msg) {
  if (this == & msg)
    return *this;
  msg_type = msg.msg_type;
  t = msg.t;
  c = msg.c;
  o = msg.o;
  d = msg.d;
  v = msg.v;
  n = msg.n;
  return  *this;

}